

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device_debug.cpp
# Opt level: O3

Vec3fa __thiscall
embree::renderPixelDebugShader
          (embree *this,DebugShaderData *data,float x,float y,ISPCCamera *camera,RayStats *stats,
          RTCFeatureFlags feature_mask)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int64_t iVar5;
  int64_t iVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  uint uVar10;
  float fVar13;
  ulong extraout_XMM1_Qa;
  ulong extraout_XMM1_Qa_00;
  undefined1 auVar12 [16];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vec3fa VVar18;
  Ray ray;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float local_b8;
  float local_b4;
  float fStack_b0;
  undefined8 uStack_ac;
  undefined8 local_a4;
  long local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_30;
  ulong uVar11;
  
  local_e8._8_4_ = (int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_e8._0_8_ = *(undefined8 *)&(camera->xfm).p.field_0;
  fVar14 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
           (camera->xfm).l.vz.field_0.field_0.x;
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar3 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar9 = y * (float)uVar2 + (float)uVar1 * x + (float)uVar3;
  fVar13 = y * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * x +
           (float)((ulong)uVar3 >> 0x20);
  fVar7 = fVar14 * fVar14 + fVar9 * fVar9 + fVar13 * fVar13;
  auVar16 = rsqrtss(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
  fVar15 = auVar16._0_4_;
  fVar7 = fVar15 * fVar15 * fVar7 * -0.5 * fVar15 + fVar15 * 1.5;
  local_d8._4_4_ = fVar7 * fVar9;
  local_d8._0_4_ = fVar14 * fVar7;
  fStack_d0 = fVar7 * fVar13;
  local_e8._12_4_ = 0;
  local_c8 = 0xffffffff7f800000;
  local_a4 = 0xffffffffffffffff;
  fStack_cc = data->debug;
  iVar5 = get_tsc();
  if (data->shader == SHADER_OCCLUSION) {
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    local_80 = (ulong)feature_mask << 0x20;
    rtcTraversableOccluded1(data->traversable,local_e8);
    uVar11 = extraout_XMM1_Qa;
  }
  else {
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    local_80 = (ulong)feature_mask << 0x20;
    rtcTraversableIntersect1(data->traversable,local_e8);
    uVar11 = extraout_XMM1_Qa_00;
  }
  iVar6 = get_tsc();
  stats->numRays = stats->numRays + 1;
  auVar16._0_8_ = uVar11;
  switch(data->shader) {
  default:
    goto switchD_00121150_caseD_0;
  case SHADER_EYELIGHT:
    if (local_a4._4_4_ == 0xffffffff) goto switchD_00121150_caseD_0;
    fVar7 = local_b8 * local_b8 + local_b4 * local_b4 + fStack_b0 * fStack_b0;
    auVar16 = rsqrtss(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar9 = auVar16._0_4_;
    fVar9 = fVar9 * fVar9 * fVar7 * -0.5 * fVar9 + fVar9 * 1.5;
    fVar7 = fVar9 * fStack_b0 * fStack_d0 +
            fVar9 * local_b4 * (float)local_d8._4_4_ + local_b8 * fVar9 * (float)local_d8._0_4_;
    auVar16._0_8_ = CONCAT44(fVar9 * 0.0 * fStack_cc,fVar7) & 0x7fffffff7fffffff;
    if (0.0 <= fStack_b0 * fStack_d0 +
               local_b4 * (float)local_d8._4_4_ + local_b8 * (float)local_d8._0_4_)
    goto LAB_0012150d;
    uVar11 = 0;
    auVar8 = ZEXT416((uint)ABS(fVar7)) << 0x20;
    break;
  case SHADER_OCCLUSION:
    uVar11 = 0;
    auVar8 = _DAT_0024cfe0;
    auVar16._0_8_ = 0;
    if (0.0 <= (float)local_c8) goto switchD_00121150_caseD_0;
    break;
  case SHADER_UV:
    if (local_a4._4_4_ == 0xffffffff) goto switchD_00121150_caseD_0;
    fVar7 = (1.0 - (float)uStack_ac) - (float)((ulong)uStack_ac >> 0x20);
    uVar11 = (ulong)(uint)fVar7;
    auVar8._8_4_ = fVar7;
    auVar8._0_8_ = uStack_ac;
    auVar8._12_4_ = 0;
    break;
  case SHADER_TEXCOORDS:
  case SHADER_TEXCOORDS_GRID:
    auVar8 = _DAT_0024ce50;
    if ((local_a4._4_4_ != 0xffffffff) &&
       (auVar8 = _DAT_0024cfd0, data->ispc_scene != (ISPCScene *)0x0)) {
      local_f0 = 0;
      local_80 = rtcGetGeometry(data->scene);
      local_78 = (uint)local_a4;
      uStack_74 = (undefined4)uStack_ac;
      uStack_70 = (undefined4)((ulong)uStack_ac >> 0x20);
      uStack_6c = 2;
      uStack_68 = 2;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_30 = 2;
      local_60 = &local_f0;
      rtcInterpolate();
      if (data->shader == SHADER_TEXCOORDS) {
        uVar11 = (ulong)(uint)local_f0._4_4_;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_f0;
      }
      else {
        uVar10 = (int)((float)local_f0 * 10.0) + (int)(local_f0._4_4_ * 10.0);
        uVar11 = CONCAT44((int)((float)local_f0 * 10.0) * 2,uVar10);
        if ((uVar10 & 1) == 0) {
          auVar8._0_12_ = ZEXT812(0x3f800000);
          auVar8._12_4_ = 0;
        }
        else {
          auVar8 = ZEXT816(0x3f80000000000000);
        }
      }
    }
    break;
  case SHADER_NG:
    if (local_a4._4_4_ != 0xffffffff) {
      auVar16._0_8_ = CONCAT44(local_b4,local_b8);
      fVar7 = local_b4 * local_b4;
      fVar9 = fStack_b0 * fStack_b0;
      fVar13 = fVar7 + local_b8 * local_b8 + fVar9;
      fVar14 = fVar7 + fVar7 + 0.0;
      fVar9 = fVar7 + fVar9 + fVar9;
      fVar7 = fVar7 + 0.0 + 0.0;
      auVar12._4_4_ = fVar14;
      auVar12._0_4_ = fVar13;
      auVar12._8_4_ = fVar9;
      auVar12._12_4_ = fVar7;
      auVar4._4_4_ = fVar14;
      auVar4._0_4_ = fVar13;
      auVar4._8_4_ = fVar9;
      auVar4._12_4_ = fVar7;
      auVar17 = rsqrtss(auVar12,auVar4);
      fVar7 = auVar17._0_4_;
      fVar7 = fVar7 * fVar7 * fVar13 * -0.5 * fVar7 + fVar7 * 1.5;
      auVar17._0_8_ = CONCAT44(fVar7 * local_b4,fVar7 * local_b8) & 0x7fffffff7fffffff;
      auVar17._8_4_ = ABS(fVar7 * fStack_b0);
      auVar17._12_4_ = ABS(fVar7 * 0.0);
      goto LAB_00121514;
    }
    goto switchD_00121150_caseD_0;
  case SHADER_CYCLES:
    auVar16._0_8_ = (ulong)(uint)((float)(iVar6 - iVar5) * data->scale);
LAB_0012150d:
    auVar17 = ZEXT416((uint)auVar16._0_8_);
LAB_00121514:
    uVar11 = auVar17._0_8_;
    *(undefined1 (*) [16])this = auVar17;
    goto LAB_00121517;
  case SHADER_GEOMID:
    if (local_a4._4_4_ != 0xffffffff) {
      auVar16._0_8_ =
           CONCAT44((float)(local_a4._4_4_ * 0x8f + 0x61 & 0xff) * 0.003921569,
                    (float)(local_a4._4_4_ * 0x87 + 0xdb & 0xff) * 0.003921569);
      fVar7 = (float)(local_a4._4_4_ * 0x85 + 0xd5 & 0xff) * 0.003921569;
      uVar11 = (ulong)(uint)fVar7;
      auVar16._8_4_ = fVar7;
      auVar16._12_4_ = 0;
      *(undefined1 (*) [16])this = auVar16;
      goto LAB_00121517;
    }
    goto switchD_00121150_caseD_0;
  case SHADER_GEOMID_PRIMID:
    if (local_a4._4_4_ != 0xffffffff) {
      local_a4._4_4_ = local_a4._4_4_ ^ (uint)local_a4;
      fVar7 = (float)(local_a4._4_4_ * 0x87 + 0xdb & 0xff) * 0.003921569;
      fVar13 = (float)(local_a4._4_4_ * 0x8f + 0x61 & 0xff) * 0.003921569;
      auVar16._0_8_ = CONCAT44(fVar13,fVar7);
      fVar9 = local_b8 * local_b8 + local_b4 * local_b4 + fStack_b0 * fStack_b0;
      auVar17 = rsqrtss(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      fVar14 = auVar17._0_4_;
      fVar9 = fVar14 * fVar14 * fVar9 * -0.5 * fVar14 + fVar14 * 1.5;
      fVar9 = fVar9 * fStack_b0 * fStack_d0 +
              fVar9 * local_b4 * (float)local_d8._4_4_ + local_b8 * fVar9 * (float)local_d8._0_4_;
      auVar17._0_4_ = ABS(fVar9) * fVar7;
      auVar17._4_4_ = ABS(fVar9) * fVar13;
      auVar17._8_4_ = ABS(fVar9) * (float)(local_a4._4_4_ * 0x85 + 0xd5 & 0xff) * 0.003921569;
      auVar17._12_4_ = ABS(fVar9) * 0.0;
      goto LAB_00121514;
    }
switchD_00121150_caseD_0:
    uVar11 = auVar16._0_8_;
    auVar8 = ZEXT816(0);
  }
  auVar16._0_8_ = auVar8._0_8_;
  *(undefined1 (*) [16])this = auVar8;
LAB_00121517:
  VVar18.field_0._8_8_ = uVar11;
  VVar18.field_0._0_8_ = auVar16._0_8_;
  return (Vec3fa)VVar18.field_0;
}

Assistant:

Vec3fa renderPixelDebugShader(const DebugShaderData& data, float x, float y, const ISPCCamera& camera, RayStats& stats, const RTCFeatureFlags feature_mask)
{
  /* initialize ray */
  Ray ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = data.debug;

  /* intersect ray with scene */
  int64_t c0 = get_tsc();
  if (data.shader == SHADER_OCCLUSION)
  {
    RTCOccludedArguments args;
    rtcInitOccludedArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableOccluded1(data.traversable,RTCRay_(ray),&args);
  }
  else
  {
    RTCIntersectArguments args;
    rtcInitIntersectArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  }

  int64_t c1 = get_tsc();
  RayStats_addRay(stats);

  /* shade pixel */
  switch (data.shader)
  {
  case SHADER_EYELIGHT:
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return Vec3fa(0.0f);
    else if (dot(ray.dir,ray.Ng) < 0.0f)
      return Vec3fa(0.0f,abs(dot(ray.dir,normalize(ray.Ng))),0.0f);
    else
      return Vec3fa(abs(dot(ray.dir,normalize(ray.Ng))),0.0f,0.0f);

  case SHADER_OCCLUSION:
    if (ray.tfar >= 0.0f) 
      return Vec3fa(0.0f,0.0f,0.0f);
    else 
      return Vec3fa(1.0f,1.0f,1.0f);

  case SHADER_UV:
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f,0.0f,0.0f);
    else return Vec3fa(ray.u,ray.v,1.0f-ray.u-ray.v);

  case SHADER_TEXCOORDS:
  case SHADER_TEXCOORDS_GRID:

#if !defined(__SYCL_DEVICE_ONLY__)
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return Vec3fa(0.0f,0.0f,1.0f);

    else if (data.ispc_scene)
    {
      Vec2f st = Vec2f(0,0);
      auto geomID = ray.geomID; {
        RTCGeometry geometry = rtcGetGeometry(data.scene,geomID);
        rtcInterpolate0(geometry,ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE,2,&st.x,2);
      }
      if (data.shader == SHADER_TEXCOORDS)
        return Vec3fa(st.x,st.y,0.0f);
      else
        return ((int)(10.0f*st.x)+(int)(10.0f*st.y)) % 2 == 0 ? Vec3fa(1,0,0) : Vec3fa(0,1,0);
    }
#endif
    
    return Vec3fa(1.0f);

  case SHADER_NG:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f,0.0f,0.0f);
    else return abs(normalize(Vec3fa(ray.Ng.x,ray.Ng.y,ray.Ng.z)));
    //else return normalize(Vec3fa(ray.Ng.x,ray.Ng.y,ray.Ng.z));

  case SHADER_GEOMID:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);
    else return randomColor(ray.geomID);
    
  case SHADER_GEOMID_PRIMID:

    if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);
    else return randomColor(ray.geomID ^ ray.primID)*Vec3fa(abs(dot(ray.dir,normalize(ray.Ng))));
    
  case SHADER_CYCLES:
    return Vec3fa((float)(c1-c0)*data.scale,0.0f,0.0f);
    
  case SHADER_AO:
    return Vec3fa(0,0,0);

  case SHADER_DEFAULT:
    return Vec3fa(0,0,0);
  }
  
  return Vec3fa(0,0,0);
}